

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::MultiplyColumn(Matrix *this,int column,Fraction coefficient)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  Fraction local_3c;
  int local_34;
  int local_30;
  int row;
  int result;
  int local_24;
  Matrix *pMStack_20;
  int column_local;
  Matrix *this_local;
  Fraction coefficient_local;
  
  local_24 = column;
  pMStack_20 = this;
  unique0x1000011e = coefficient;
  Fraction::Fraction((Fraction *)&row,1);
  bVar1 = operator==((Fraction *)((long)&this_local + 4),(Fraction *)&row);
  if (bVar1) {
    coefficient_local.numerator_._3_1_ = false;
  }
  else {
    local_30 = 0;
    for (local_34 = 0; local_34 < this->n_; local_34 = local_34 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_34);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_24);
      Fraction::Fraction(&local_3c,0);
      bVar1 = operator!=(pvVar3,&local_3c);
      if (bVar1) {
        local_30 = 1;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_34);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_24)
        ;
        Fraction::operator*=(pvVar3,(Fraction *)((long)&this_local + 4));
      }
    }
    coefficient_local.numerator_._3_1_ = local_30 != 0;
  }
  return coefficient_local.numerator_._3_1_;
}

Assistant:

bool Matrix::MultiplyColumn(int column, Fraction coefficient) {
  if (coefficient == 1) {
    return false;
  }

  int result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][column] != 0) {
      result = true;
      elements_[row][column] *= coefficient;
    }
  }

  return result;
}